

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_Person.cpp
# Opt level: O1

void __thiscall mbc::Val::Person::~Person(Person *this)

{
  (this->super_ValBase)._vptr_ValBase = (_func_int **)&PTR__Person_001407b8;
  if (*(this->super_ValBase).count_ == 1) {
    if (this->ID_ != (Str *)0x0) {
      (*(this->ID_->super__ValAtom).super_ValBase._vptr_ValBase[1])();
    }
    if (this->name_ != (Str *)0x0) {
      (*(this->name_->super__ValAtom).super_ValBase._vptr_ValBase[1])();
    }
    if (this->sex_ != (Str *)0x0) {
      (*(this->sex_->super__ValAtom).super_ValBase._vptr_ValBase[1])();
    }
    if (this->telephone_ != (Str *)0x0) {
      (*(this->telephone_->super__ValAtom).super_ValBase._vptr_ValBase[1])();
    }
    if (this->mail_number_ != (Str *)0x0) {
      (*(this->mail_number_->super__ValAtom).super_ValBase._vptr_ValBase[1])();
    }
    if (this->email_ != (Str *)0x0) {
      (*(this->email_->super__ValAtom).super_ValBase._vptr_ValBase[1])();
    }
    if (this->qq_number_ != (Str *)0x0) {
      (*(this->qq_number_->super__ValAtom).super_ValBase._vptr_ValBase[1])();
    }
    if (this->location_ != (Str *)0x0) {
      (*(this->location_->super__ValAtom).super_ValBase._vptr_ValBase[1])();
    }
    if (this->classes_ != (VecStr *)0x0) {
      (*(this->classes_->super__ValAtom).super_ValBase._vptr_ValBase[1])();
    }
  }
  ValBase::~ValBase(&this->super_ValBase);
  return;
}

Assistant:

Person::~Person() {
    if (*count_ == 1) {
        delete ID_;
        delete name_;
        delete sex_;
        delete telephone_;
        delete mail_number_;
        delete email_;
        delete qq_number_;
        delete location_;
        delete classes_;
    }
}